

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::SingleArena_ConstructEmptyWithDefault_Test::
~SingleArena_ConstructEmptyWithDefault_Test(SingleArena_ConstructEmptyWithDefault_Test *this)

{
  ~SingleArena_ConstructEmptyWithDefault_Test
            ((SingleArena_ConstructEmptyWithDefault_Test *)
             &this[-1].super_SingleArena.super_TestWithParam<bool>.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(SingleArena, ConstructEmptyWithDefault) {
  auto arena = GetArena();
  internal::LazyString default_value{{{"Hello default", 13}}, {nullptr}};
  ArenaStringPtr field(arena.get(), default_value);

  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_EQ(field.Get(), "Hello default");
    EXPECT_FALSE(field.IsDefault());
  } else {
    EXPECT_EQ(field.Get(), "");
    EXPECT_TRUE(field.IsDefault());
  }
  if (arena == nullptr) field.Destroy();
}